

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::PathDescriptionSyntax::getChild(PathDescriptionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  undefined8 in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff68;
  TokenOrSyntax *in_stack_ffffffffffffff70;
  nullptr_t in_stack_ffffffffffffff78;
  
  switch(in_RDX) {
  case 0:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token);
    break;
  case 1:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token_00);
    break;
  case 2:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x38),in_stack_ffffffffffffff68);
    break;
  case 3:
    token_01.info = in_RDI;
    token_01._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token_01);
    break;
  case 4:
    token_02.info = in_RDI;
    token_02._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token_02);
    break;
  case 5:
    not_null<slang::syntax::PathSuffixSyntax_*>::get
              ((not_null<slang::syntax::PathSuffixSyntax_*> *)(in_RSI + 0x90));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 6:
    token_03.info = in_RDI;
    token_03._0_8_ = in_stack_ffffffffffffff78;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff70,token_03);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffff78);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax PathDescriptionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openParen;
        case 1: return edgeIdentifier;
        case 2: return &inputs;
        case 3: return polarityOperator;
        case 4: return pathOperator;
        case 5: return suffix.get();
        case 6: return closeParen;
        default: return nullptr;
    }
}